

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(ze_device_uuid_t val)

{
  string *in_RDI;
  long lVar1;
  string tmp;
  string sStack_b8;
  byte local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    std::__cxx11::to_string(&sStack_b8,(uint)local_98[lVar1]);
    std::__cxx11::string::append((string *)&local_88);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::append((char *)&local_88);
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)&local_88);
  std::operator+(&local_48,"[ ",&local_68);
  std::operator+(&sStack_b8,&local_48," ]");
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string( const ze_device_uuid_t val )
{
    std::string str;
    
    str += "device_uuid_t::id : ";
    {
        std::string tmp;
        for( auto& entry : val.id )
        {
            tmp += std::to_string( entry );
            tmp += ", ";
        }
        str += "[ " + tmp.substr( 0, tmp.size() - 2 ) + " ]";;
    }
    str += "\n";

    return str;
}